

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_distFcnElement.cpp
# Opt level: O3

void __thiscall amrex::SplineDistFcnElement2d::print_spline(SplineDistFcnElement2d *this)

{
  return;
}

Assistant:

void SplineDistFcnElement2d::print_spline() const {
#if 0
  int nsplines = Dx.size();

  amrex::Real dt = 0.01;
  int nt = static_cast<int>(1.0/dt);
  for (int i=0; i<nsplines-1; i++) {
    for (int j=0; j<nt; j++) {
      amrex::Real x = eval(j*dt, control_points_x[i],
                           control_points_x[i+1], Dx[i], Dx[i+1]);
      amrex::Real y = eval(j*dt, control_points_y[i],
                           control_points_y[i+1], Dy[i], Dy[i+1]);

    }
  }
#endif
}